

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChValueSpecific<chrono::ChSharedMassBody>::CallArchiveOut
          (ChValueSpecific<chrono::ChSharedMassBody> *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChSharedMassBody>(marchive);
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  return;
}

Assistant:

virtual void CallArchiveOut(ChArchiveOut& marchive) { 
          this->_archive_out(marchive);
      }